

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void __thiscall qclab::print<double>(qclab *this,complex<double> val)

{
  complex<double> *pcVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double dVar3;
  double extraout_XMM0_Qa_00;
  char local_2a;
  char sign;
  double imag;
  double real;
  complex<double> val_local;
  
  dVar2 = std::real<double>((complex<double> *)&real);
  pcVar1 = (complex<double> *)&real;
  std::imag<double>(pcVar1);
  std::abs((int)pcVar1);
  dVar3 = std::imag<double>((complex<double> *)&real);
  local_2a = '+';
  if (dVar3 < 0.0) {
    local_2a = '-';
  }
  pcVar1 = (complex<double> *)&real;
  dVar3 = std::abs<double>(pcVar1);
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    std::abs((int)pcVar1);
    if ((extraout_XMM0_Qa_00 != 0.0) || (NAN(extraout_XMM0_Qa_00))) {
      if ((extraout_XMM0_Qa != 0.0) || (NAN(extraout_XMM0_Qa))) {
        printf("%10.4f %c %6.4fi",dVar2,extraout_XMM0_Qa,(ulong)(uint)(int)local_2a);
      }
      else {
        printf("%10.4f %c      0i",dVar2,(ulong)(uint)(int)local_2a);
      }
    }
    else {
      printf("         0 %c %6.4fi",extraout_XMM0_Qa,(ulong)(uint)(int)local_2a);
    }
  }
  else {
    printf("                   0");
  }
  return;
}

Assistant:

void print( const std::complex< T > val ) {
    const T real = std::real( val ) ;
    const T imag = std::abs( std::imag( val ) ) ;
    const char sign = std::imag( val ) >= T(0) ? '+' : '-' ;
    if ( std::abs( val ) == T(0) ) {
      std::printf( "                   0" ) ;
    } else if ( std::abs( real ) == T(0) ) {
      std::printf( "         0 %c %6.4fi" , sign , imag ) ;
    } else if ( imag == T(0) ) {
      std::printf( "%10.4f %c      0i" , real , sign ) ;
    } else {
      std::printf( "%10.4f %c %6.4fi" , real , sign , imag ) ;
    }
  }